

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O3

int xmlRelaxNGAddStates(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGStatesPtr states,
                       xmlRelaxNGValidStatePtr state)

{
  int iVar1;
  xmlRelaxNGValidStatePtr pxVar2;
  int iVar3;
  uint uVar4;
  xmlRelaxNGValidStatePtr *ppxVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  
  iVar3 = -1;
  if (states != (xmlRelaxNGStatesPtr)0x0 && state != (xmlRelaxNGValidStatePtr)0x0) {
    iVar3 = states->nbState;
    iVar1 = states->maxState;
    if (iVar1 <= iVar3) {
      ppxVar5 = (xmlRelaxNGValidStatePtr *)(*xmlRealloc)(states->tabState,(long)iVar1 << 4);
      if (ppxVar5 == (xmlRelaxNGValidStatePtr *)0x0) {
        xmlRngVErrMemory(ctxt);
        return -1;
      }
      states->tabState = ppxVar5;
      states->maxState = iVar1 * 2;
      iVar3 = states->nbState;
    }
    if (iVar3 < 1) {
      lVar6 = (long)iVar3;
    }
    else {
      lVar8 = 0;
      do {
        pxVar2 = states->tabState[lVar8];
        if (pxVar2 != (xmlRelaxNGValidStatePtr)0x0) {
          if (pxVar2 == state) goto LAB_0018a7c7;
          if ((((state->node == pxVar2->node) && (state->seq == pxVar2->seq)) &&
              (state->nbAttrLeft == pxVar2->nbAttrLeft)) &&
             ((uVar4 = state->nbAttrs, uVar4 == pxVar2->nbAttrs &&
              (state->endvalue == pxVar2->endvalue)))) {
            if (state->value != pxVar2->value) {
              iVar3 = xmlStrEqual(state->value,pxVar2->value);
              if (iVar3 == 0) goto LAB_0018a77c;
              uVar4 = state->nbAttrs;
            }
            if ((int)uVar4 < 1) {
LAB_0018a7c7:
              xmlRelaxNGFreeValidState(ctxt,state);
              return 0;
            }
            uVar7 = 0;
            while (state->attrs[uVar7] == pxVar2->attrs[uVar7]) {
              uVar7 = uVar7 + 1;
              if (uVar4 == uVar7) goto LAB_0018a7c7;
            }
          }
        }
LAB_0018a77c:
        lVar8 = lVar8 + 1;
        iVar3 = states->nbState;
        lVar6 = (long)iVar3;
      } while (lVar8 < lVar6);
    }
    states->nbState = iVar3 + 1;
    states->tabState[lVar6] = state;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int
xmlRelaxNGAddStates(xmlRelaxNGValidCtxtPtr ctxt,
                    xmlRelaxNGStatesPtr states,
                    xmlRelaxNGValidStatePtr state)
{
    int i;

    if (state == NULL || states == NULL) {
        return (-1);
    }
    if (states->nbState >= states->maxState) {
        xmlRelaxNGValidStatePtr *tmp;
        int size;

        size = states->maxState * 2;
        tmp = (xmlRelaxNGValidStatePtr *) xmlRealloc(states->tabState,
                                                     (size) *
                                                     sizeof
                                                     (xmlRelaxNGValidStatePtr));
        if (tmp == NULL) {
            xmlRngVErrMemory(ctxt);
            return (-1);
        }
        states->tabState = tmp;
        states->maxState = size;
    }
    for (i = 0; i < states->nbState; i++) {
        if (xmlRelaxNGEqualValidState(ctxt, state, states->tabState[i])) {
            xmlRelaxNGFreeValidState(ctxt, state);
            return (0);
        }
    }
    states->tabState[states->nbState++] = state;
    return (1);
}